

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionHelper.cpp
# Opt level: O0

void __thiscall
EncryptionHelper::OnObjectStart
          (EncryptionHelper *this,longlong inObjectID,longlong inGenerationNumber)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  iterator it;
  longlong inGenerationNumber_local;
  longlong inObjectID_local;
  EncryptionHelper *this_local;
  
  it._M_node = (_Base_ptr)inGenerationNumber;
  bVar1 = IsEncrypting(this);
  if (bVar1) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>_>
         ::begin(&this->mXcrypts);
    while( true ) {
      local_30._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>_>
           ::end(&this->mXcrypts);
      bVar1 = std::operator!=(&local_28,&local_30);
      if (!bVar1) break;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>
               ::operator->(&local_28);
      XCryptionCommon::OnObjectStart_abi_cxx11_(ppVar2->second,inObjectID,(longlong)it._M_node);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>
      ::operator++(&local_28);
    }
  }
  return;
}

Assistant:

void EncryptionHelper::OnObjectStart(long long inObjectID, long long inGenerationNumber) {
	if (!IsEncrypting())
		return;

	StringToXCryptionCommonMap::iterator it = mXcrypts.begin();
	for (; it != mXcrypts.end(); ++it) {
		it->second->OnObjectStart(inObjectID, inGenerationNumber);
	}
}